

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesTest::createMultisampleTestInstance
          (RasterizationSamplesTest *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *colorBlendState)

{
  uint uVar1;
  VkFormat VVar2;
  MultisampleRenderer *pMVar3;
  void *pvVar4;
  VkSampleMask *pVVar5;
  undefined4 uVar6;
  VkPipelineMultisampleStateCreateFlags VVar7;
  VkSampleCountFlagBits VVar8;
  VkBool32 VVar9;
  float fVar10;
  VkBool32 VVar11;
  VkBool32 VVar12;
  VkBlendFactor VVar13;
  VkBlendFactor VVar14;
  VkBlendOp VVar15;
  VkBlendFactor VVar16;
  VkBlendFactor VVar17;
  VkBlendOp VVar18;
  VkColorComponentFlags VVar19;
  TestInstance *pTVar20;
  InstanceInterface *pIVar21;
  VkPhysicalDevice pVVar22;
  MultisampleRenderer *pMVar23;
  NotSupportedError *this_00;
  VkFormat VVar24;
  long lVar25;
  Context **local_c0;
  TestInstance *local_b8;
  VkPrimitiveTopology pTopology [2];
  VkFormatProperties formatProps;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_90;
  Move<vk::Handle<(vk::HandleType)14>_> *local_68;
  Move<vk::Handle<(vk::HandleType)14>_> *local_60;
  Move<vk::Handle<(vk::HandleType)23>_> *local_58;
  Move<vk::Handle<(vk::HandleType)17>_> *local_50;
  Move<vk::Handle<(vk::HandleType)9>_> *local_48;
  Move<vk::Handle<(vk::HandleType)13>_> *local_40;
  Move<vk::Handle<(vk::HandleType)9>_> *local_38;
  
  pTVar20 = (TestInstance *)operator_new(0x68);
  uVar1 = this->m_modeFlags;
  pTVar20->m_context = context;
  pTVar20->_vptr_TestInstance = (_func_int **)&PTR__RasterizationSamplesInstance_00d575e0;
  pTVar20[1]._vptr_TestInstance = (_func_int **)0x2000000025;
  *(undefined4 *)&pTVar20[1].m_context = 0x20;
  *(VkPrimitiveTopology *)((long)&pTVar20[1].m_context + 4) = topology;
  local_b8 = pTVar20 + 2;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             local_b8,vertices);
  local_c0 = &pTVar20[3].m_context;
  generateVertices((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    *)local_c0,GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH);
  *(uint *)&pTVar20[5]._vptr_TestInstance = uVar1;
  pTVar20[5].m_context = (Context *)0x0;
  if (uVar1 == 0) {
    pMVar23 = (MultisampleRenderer *)operator_new(0x2b0);
    MultisampleRenderer::MultisampleRenderer
              (pMVar23,context,*(VkFormat *)&pTVar20[1]._vptr_TestInstance,
               (IVec2 *)((long)&pTVar20[1]._vptr_TestInstance + 4),topology,vertices,
               multisampleStateParams,colorBlendState);
    pMVar3 = (MultisampleRenderer *)pTVar20[5].m_context;
    if (pMVar3 != pMVar23) {
      if (pMVar3 != (MultisampleRenderer *)0x0) {
        (*pMVar3->_vptr_MultisampleRenderer[1])();
        pTVar20[5].m_context = (Context *)0x0;
      }
      pTVar20[5].m_context = (Context *)pMVar23;
    }
  }
  else {
    VVar24 = VK_FORMAT_D16_UNORM;
    if ((uVar1 & 3) != 1) {
      pIVar21 = Context::getInstanceInterface(context);
      pVVar22 = Context::getPhysicalDevice(context);
      VVar24 = VK_FORMAT_D24_UNORM_S8_UINT;
      (*pIVar21->_vptr_InstanceInterface[3])(pIVar21,pVVar22,0x81,&formatProps);
      if ((formatProps.optimalTilingFeatures >> 9 & 1) == 0) {
        (*pIVar21->_vptr_InstanceInterface[3])(pIVar21,pVVar22,0x82,&formatProps);
        VVar24 = (int)(formatProps.optimalTilingFeatures << 0x16) >> 0x1f &
                 VK_FORMAT_D32_SFLOAT_S8_UINT;
      }
    }
    if (VVar24 == VK_FORMAT_UNDEFINED) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Required depth/stencil format is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleTests.cpp"
                 ,0x3c0);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pTopology[0] = *(VkPrimitiveTopology *)((long)&pTVar20[1].m_context + 4);
    pTopology[1] = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &formatProps,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               local_b8);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
              (&local_90,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               local_c0);
    pMVar23 = (MultisampleRenderer *)operator_new(0x2b0);
    VVar2 = *(VkFormat *)&pTVar20[1]._vptr_TestInstance;
    pMVar23->_vptr_MultisampleRenderer = (_func_int **)&PTR__MultisampleRenderer_00d57628;
    pMVar23->m_context = context;
    pMVar23->m_colorFormat = VVar2;
    pMVar23->m_depthStencilFormat = VVar24;
    *(undefined8 *)(pMVar23->m_renderSize).m_data =
         *(undefined8 *)((long)&pTVar20[1]._vptr_TestInstance + 4);
    pMVar23->m_useDepth = (bool)((byte)uVar1 & 1);
    pMVar23->m_useStencil = (bool)((byte)uVar1 >> 1 & 1);
    uVar6 = *(undefined4 *)&multisampleStateParams->field_0x4;
    pvVar4 = multisampleStateParams->pNext;
    VVar7 = multisampleStateParams->flags;
    VVar8 = multisampleStateParams->rasterizationSamples;
    VVar9 = multisampleStateParams->sampleShadingEnable;
    fVar10 = multisampleStateParams->minSampleShading;
    pVVar5 = multisampleStateParams->pSampleMask;
    VVar11 = multisampleStateParams->alphaToCoverageEnable;
    VVar12 = multisampleStateParams->alphaToOneEnable;
    (pMVar23->m_multisampleStateParams).sType = multisampleStateParams->sType;
    *(undefined4 *)&(pMVar23->m_multisampleStateParams).field_0x4 = uVar6;
    (pMVar23->m_multisampleStateParams).pNext = pvVar4;
    (pMVar23->m_multisampleStateParams).flags = VVar7;
    (pMVar23->m_multisampleStateParams).rasterizationSamples = VVar8;
    (pMVar23->m_multisampleStateParams).sampleShadingEnable = VVar9;
    (pMVar23->m_multisampleStateParams).minSampleShading = fVar10;
    (pMVar23->m_multisampleStateParams).pSampleMask = pVVar5;
    (pMVar23->m_multisampleStateParams).alphaToCoverageEnable = VVar11;
    (pMVar23->m_multisampleStateParams).alphaToOneEnable = VVar12;
    VVar13 = colorBlendState->srcColorBlendFactor;
    VVar14 = colorBlendState->dstColorBlendFactor;
    VVar15 = colorBlendState->colorBlendOp;
    VVar16 = colorBlendState->srcAlphaBlendFactor;
    VVar17 = colorBlendState->dstAlphaBlendFactor;
    VVar18 = colorBlendState->alphaBlendOp;
    VVar19 = colorBlendState->colorWriteMask;
    (pMVar23->m_colorBlendState).blendEnable = colorBlendState->blendEnable;
    (pMVar23->m_colorBlendState).srcColorBlendFactor = VVar13;
    (pMVar23->m_colorBlendState).dstColorBlendFactor = VVar14;
    (pMVar23->m_colorBlendState).colorBlendOp = VVar15;
    (pMVar23->m_colorBlendState).srcAlphaBlendFactor = VVar16;
    (pMVar23->m_colorBlendState).dstAlphaBlendFactor = VVar17;
    (pMVar23->m_colorBlendState).alphaBlendOp = VVar18;
    (pMVar23->m_colorBlendState).colorWriteMask = VVar19;
    local_38 = &pMVar23->m_resolveImage;
    local_40 = &pMVar23->m_resolveAttachmentView;
    local_48 = &pMVar23->m_depthStencilImage;
    local_50 = &pMVar23->m_renderPass;
    local_58 = &pMVar23->m_framebuffer;
    local_60 = &pMVar23->m_vertexShaderModule;
    local_68 = &pMVar23->m_fragmentShaderModule;
    (pMVar23->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
         0;
    (pMVar23->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar23->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    (pMVar23->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)0x0;
    (pMVar23->m_colorImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    (pMVar23->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = 0;
    (pMVar23->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar23->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = (VkDevice)0x0;
    (pMVar23->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar23->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
         = 0;
    (pMVar23->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar23->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
         = (VkDevice)0x0;
    (pMVar23->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar23->m_resolveImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    (pMVar23->m_depthStencilImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    (pMVar23->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_device = (VkDevice)0x0;
    (pMVar23->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar23->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
    m_internal = 0;
    (pMVar23->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    (pMVar23->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
    .m_device = (VkDevice)0x0;
    (pMVar23->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
    .m_allocator = (VkAllocationCallbacks *)0x0;
    (pMVar23->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
    m_internal = 0;
    (pMVar23->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
    .m_deviceIface = (DeviceInterface *)0x0;
    memset(&pMVar23->m_depthStencilAttachmentView,0,200);
    memset(&pMVar23->m_pipelineLayout,0,0x98);
    MultisampleRenderer::initialize
              (pMVar23,context,2,pTopology,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &formatProps);
    pMVar3 = (MultisampleRenderer *)pTVar20[5].m_context;
    if (pMVar3 != pMVar23) {
      if (pMVar3 != (MultisampleRenderer *)0x0) {
        (*pMVar3->_vptr_MultisampleRenderer[1])();
        pTVar20[5].m_context = (Context *)0x0;
      }
      pTVar20[5].m_context = (Context *)pMVar23;
    }
    lVar25 = 0x30;
    do {
      pvVar4 = *(void **)((long)&local_c0 + lVar25);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,*(long *)((long)pTopology + lVar25) - (long)pvVar4);
      }
      lVar25 = lVar25 + -0x18;
    } while (lVar25 != 0);
  }
  return pTVar20;
}

Assistant:

TestInstance* RasterizationSamplesTest::createMultisampleTestInstance (Context&										context,
																	   VkPrimitiveTopology							topology,
																	   const std::vector<Vertex4RGBA>&				vertices,
																	   const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
																	   const VkPipelineColorBlendAttachmentState&	colorBlendState) const
{
	return new RasterizationSamplesInstance(context, topology, vertices, multisampleStateParams, colorBlendState, m_modeFlags);
}